

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void emit_scalar_assign(c2m_ctx_t c2m_ctx,op_t var,op_t *val,MIR_type_t t,int ignore_others_p)

{
  int iVar1;
  MIR_context_t ctx_00;
  MIR_op_t op1;
  MIR_op_t op1_00;
  MIR_op_t op1_01;
  MIR_op_t op2;
  MIR_op_t op2_00;
  MIR_op_t op3;
  MIR_op_t op3_00;
  MIR_op_t op3_01;
  MIR_op_t op3_02;
  MIR_op_t op3_03;
  MIR_op_t op3_04;
  MIR_op_t op1_02;
  MIR_op_t op1_03;
  MIR_op_t op2_01;
  MIR_op_t op2_02;
  MIR_op_t op1_04;
  MIR_op_t op1_05;
  MIR_op_t op2_03;
  MIR_op_t op1_06;
  MIR_op_t op2_04;
  MIR_op_t op2_05;
  MIR_insn_code_t code;
  int iVar2;
  mir_size_t mVar3;
  ulong u;
  MIR_op_t local_348;
  op_t local_318;
  MIR_op_t local_2d8;
  MIR_op_t local_2a8;
  MIR_op_t local_278;
  MIR_op_t local_248;
  op_t local_218;
  op_t local_1d8;
  op_t local_198;
  long local_150;
  size_t size;
  op_t temp_op4;
  op_t temp_op3;
  op_t temp_op2;
  op_t temp_op1;
  uint64_t mask2;
  uint64_t mask;
  int width;
  MIR_context_t ctx;
  int ignore_others_p_local;
  MIR_type_t t_local;
  op_t *val_local;
  c2m_ctx_t c2m_ctx_local;
  
  op2_05 = var.mir_op;
  if ((var.decl == (decl_t)0x0) || ((var.decl)->bit_offset < 0)) {
    code = tp_mov(t);
    emit2_noopt(c2m_ctx,code,var.mir_op,val->mir_op);
  }
  else {
    ctx_00 = c2m_ctx->ctx;
    iVar1 = (var.decl)->width;
    mVar3 = type_size(c2m_ctx,((var.decl)->decl_spec).type);
    local_150 = mVar3 << 3;
    if ((var.mir_op._8_2_ & 0xff) != 10) {
      __assert_fail("var.mir_op.mode == MIR_OP_MEM",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x2dce,"void emit_scalar_assign(c2m_ctx_t, op_t, op_t *, MIR_type_t, int)");
    }
    u = 0xffffffffffffffff >> (0x40U - (char)iVar1 & 0x3f);
    iVar2 = (var.decl)->bit_offset;
    get_new_temp(&local_198,c2m_ctx,MIR_T_I64);
    memcpy((void *)((long)&temp_op2.mir_op.u + 0x18),&local_198,0x40);
    get_new_temp(&local_1d8,c2m_ctx,MIR_T_I64);
    memcpy((void *)((long)&temp_op3.mir_op.u + 0x18),&local_1d8,0x40);
    get_new_temp(&local_218,c2m_ctx,MIR_T_I64);
    memcpy((void *)((long)&temp_op4.mir_op.u + 0x18),&local_218,0x40);
    if (ignore_others_p == 0) {
      op1._8_8_ = temp_op2.mir_op.data;
      op1.data = (void *)temp_op2._8_8_;
      op1.u.i = temp_op2.mir_op._8_8_;
      op1.u._8_8_ = temp_op2.mir_op.u.i;
      op1.u._16_8_ = temp_op2.mir_op.u.str.s;
      op1.u.mem.disp = temp_op2.mir_op.u._16_8_;
      emit2_noopt(c2m_ctx,MIR_MOV,op1,op2_05);
      MIR_new_uint_op(&local_248,ctx_00,u << ((byte)iVar2 & 0x3f) ^ 0xffffffffffffffff);
      op2_02._8_8_ = temp_op2.mir_op.data;
      op2_02.data = (void *)temp_op2._8_8_;
      op2_02.u.i = temp_op2.mir_op._8_8_;
      op2_02.u._8_8_ = temp_op2.mir_op.u.i;
      op2_02.u._16_8_ = temp_op2.mir_op.u.str.s;
      op2_02.u.mem.disp = temp_op2.mir_op.u._16_8_;
      op1_04._8_8_ = temp_op2.mir_op.data;
      op1_04.data = (void *)temp_op2._8_8_;
      op1_04.u.i = temp_op2.mir_op._8_8_;
      op1_04.u._8_8_ = temp_op2.mir_op.u.i;
      op1_04.u._16_8_ = temp_op2.mir_op.u.str.s;
      op1_04.u.mem.disp = temp_op2.mir_op.u._16_8_;
      op3._8_8_ = local_248._8_8_;
      op3.data = local_248.data;
      op3.u.i = local_248.u.i;
      op3.u.str.s = local_248.u.str.s;
      op3.u._16_8_ = local_248.u._16_8_;
      op3.u.mem.disp = local_248.u.mem.disp;
      emit3(c2m_ctx,MIR_AND,op1_04,op2_02,op3);
    }
    iVar2 = signed_integer_type_p(((var.decl)->decl_spec).type);
    if (iVar2 == 0) {
      op1_00._8_8_ = temp_op1.mir_op.data;
      op1_00.data = (void *)temp_op1._8_8_;
      op1_00.u.i = temp_op1.mir_op._8_8_;
      op1_00.u._8_8_ = temp_op1.mir_op.u.i;
      op1_00.u._16_8_ = temp_op1.mir_op.u.str.s;
      op1_00.u.mem.disp = temp_op1.mir_op.u._16_8_;
      emit2(c2m_ctx,MIR_MOV,op1_00,val->mir_op);
      memcpy(val,(void *)((long)&temp_op4.mir_op.u + 0x18),0x40);
    }
    else {
      MIR_new_int_op(&local_278,ctx_00,(long)(0x40 - iVar1));
      op1_05._8_8_ = temp_op1.mir_op.data;
      op1_05.data = (void *)temp_op1._8_8_;
      op1_05.u.i = temp_op1.mir_op._8_8_;
      op1_05.u._8_8_ = temp_op1.mir_op.u.i;
      op1_05.u._16_8_ = temp_op1.mir_op.u.str.s;
      op1_05.u.mem.disp = temp_op1.mir_op.u._16_8_;
      op3_00._8_8_ = local_278._8_8_;
      op3_00.data = local_278.data;
      op3_00.u.i = local_278.u.i;
      op3_00.u.str.s = local_278.u.str.s;
      op3_00.u._16_8_ = local_278.u._16_8_;
      op3_00.u.mem.disp = local_278.u.mem.disp;
      emit3(c2m_ctx,MIR_LSH,op1_05,val->mir_op,op3_00);
      MIR_new_int_op(&local_2a8,ctx_00,(long)(0x40 - iVar1));
      op2_03._8_8_ = temp_op1.mir_op.data;
      op2_03.data = (void *)temp_op1._8_8_;
      op2_03.u.i = temp_op1.mir_op._8_8_;
      op2_03.u._8_8_ = temp_op1.mir_op.u.i;
      op2_03.u._16_8_ = temp_op1.mir_op.u.str.s;
      op2_03.u.mem.disp = temp_op1.mir_op.u._16_8_;
      op1_06._8_8_ = temp_op1.mir_op.data;
      op1_06.data = (void *)temp_op1._8_8_;
      op1_06.u.i = temp_op1.mir_op._8_8_;
      op1_06.u._8_8_ = temp_op1.mir_op.u.i;
      op1_06.u._16_8_ = temp_op1.mir_op.u.str.s;
      op1_06.u.mem.disp = temp_op1.mir_op.u._16_8_;
      op3_01._8_8_ = local_2a8._8_8_;
      op3_01.data = local_2a8.data;
      op3_01.u.i = local_2a8.u.i;
      op3_01.u.str.s = local_2a8.u.str.s;
      op3_01.u._16_8_ = local_2a8.u._16_8_;
      op3_01.u.mem.disp = local_2a8.u.mem.disp;
      emit3(c2m_ctx,MIR_RSH,op1_06,op2_03,op3_01);
      memcpy(val,(void *)((long)&temp_op2.mir_op.u + 0x18),0x40);
    }
    MIR_new_uint_op(&local_2d8,ctx_00,u);
    op2_04._8_8_ = temp_op1.mir_op.data;
    op2_04.data = (void *)temp_op1._8_8_;
    op2_04.u.i = temp_op1.mir_op._8_8_;
    op2_04.u._8_8_ = temp_op1.mir_op.u.i;
    op2_04.u._16_8_ = temp_op1.mir_op.u.str.s;
    op2_04.u.mem.disp = temp_op1.mir_op.u._16_8_;
    op1_03._8_8_ = temp_op3.mir_op.data;
    op1_03.data = (void *)temp_op3._8_8_;
    op1_03.u.i = temp_op3.mir_op._8_8_;
    op1_03.u._8_8_ = temp_op3.mir_op.u.i;
    op1_03.u._16_8_ = temp_op3.mir_op.u.str.s;
    op1_03.u.mem.disp = temp_op3.mir_op.u._16_8_;
    op3_02._8_8_ = local_2d8._8_8_;
    op3_02.data = local_2d8.data;
    op3_02.u.i = local_2d8.u.i;
    op3_02.u.str.s = local_2d8.u.str.s;
    op3_02.u._16_8_ = local_2d8.u._16_8_;
    op3_02.u.mem.disp = local_2d8.u.mem.disp;
    emit3(c2m_ctx,MIR_AND,op1_03,op2_04,op3_02);
    get_new_temp(&local_318,c2m_ctx,MIR_T_I64);
    memcpy(&size,&local_318,0x40);
    if ((var.decl)->bit_offset == 0) {
      memcpy(&size,(void *)((long)&temp_op4.mir_op.u + 0x18),0x40);
    }
    else {
      MIR_new_int_op(&local_348,ctx_00,(long)(var.decl)->bit_offset);
      op2_01._8_8_ = temp_op3.mir_op.data;
      op2_01.data = (void *)temp_op3._8_8_;
      op2_01.u.i = temp_op3.mir_op._8_8_;
      op2_01.u._8_8_ = temp_op3.mir_op.u.i;
      op2_01.u._16_8_ = temp_op3.mir_op.u.str.s;
      op2_01.u.mem.disp = temp_op3.mir_op.u._16_8_;
      op1_02._8_8_ = temp_op4.mir_op.data;
      op1_02.data = (void *)temp_op4._8_8_;
      op1_02.u.i = temp_op4.mir_op._8_8_;
      op1_02.u._8_8_ = temp_op4.mir_op.u.i;
      op1_02.u._16_8_ = temp_op4.mir_op.u.str.s;
      op1_02.u.mem.disp = temp_op4.mir_op.u._16_8_;
      op3_03._8_8_ = local_348._8_8_;
      op3_03.data = local_348.data;
      op3_03.u.i = local_348.u.i;
      op3_03.u.str.s = local_348.u.str.s;
      op3_03.u._16_8_ = local_348.u._16_8_;
      op3_03.u.mem.disp = local_348.u.mem.disp;
      emit3(c2m_ctx,MIR_LSH,op1_02,op2_01,op3_03);
    }
    if (ignore_others_p == 0) {
      op1_01._8_8_ = temp_op4.mir_op.data;
      op1_01.data = (void *)temp_op4._8_8_;
      op1_01.u.i = temp_op4.mir_op._8_8_;
      op1_01.u._8_8_ = temp_op4.mir_op.u.i;
      op1_01.u._16_8_ = temp_op4.mir_op.u.str.s;
      op1_01.u.mem.disp = temp_op4.mir_op.u._16_8_;
      op2._8_8_ = temp_op4.mir_op.data;
      op2.data = (void *)temp_op4._8_8_;
      op2.u.i = temp_op4.mir_op._8_8_;
      op2.u._8_8_ = temp_op4.mir_op.u.i;
      op2.u._16_8_ = temp_op4.mir_op.u.str.s;
      op2.u.mem.disp = temp_op4.mir_op.u._16_8_;
      op3_04._8_8_ = temp_op2.mir_op.data;
      op3_04.data = (void *)temp_op2._8_8_;
      op3_04.u.i = temp_op2.mir_op._8_8_;
      op3_04.u._8_8_ = temp_op2.mir_op.u.i;
      op3_04.u._16_8_ = temp_op2.mir_op.u.str.s;
      op3_04.u.mem.disp = temp_op2.mir_op.u._16_8_;
      emit3(c2m_ctx,MIR_OR,op1_01,op2,op3_04);
    }
    op2_00._8_8_ = temp_op4.mir_op.data;
    op2_00.data = (void *)temp_op4._8_8_;
    op2_00.u.i = temp_op4.mir_op._8_8_;
    op2_00.u._8_8_ = temp_op4.mir_op.u.i;
    op2_00.u._16_8_ = temp_op4.mir_op.u.str.s;
    op2_00.u.mem.disp = temp_op4.mir_op.u._16_8_;
    emit2(c2m_ctx,MIR_MOV,op2_05,op2_00);
  }
  return;
}

Assistant:

static void emit_scalar_assign (c2m_ctx_t c2m_ctx, op_t var, op_t *val, MIR_type_t t,
                                int ignore_others_p) {
  if (var.decl == NULL || var.decl->bit_offset < 0) {
    emit2_noopt (c2m_ctx, tp_mov (t), var.mir_op, val->mir_op);
  } else {
    MIR_context_t ctx = c2m_ctx->ctx;
    int width = var.decl->width;
    uint64_t mask, mask2;
    op_t temp_op1, temp_op2, temp_op3, temp_op4;
    size_t MIR_UNUSED size = type_size (c2m_ctx, var.decl->decl_spec.type) * MIR_CHAR_BIT;

    assert (var.mir_op.mode == MIR_OP_MEM); /*???*/
    mask = 0xffffffffffffffff >> (64 - width);
#if __BYTE_ORDER__ == __ORDER_LITTLE_ENDIAN__
    mask2 = ~(mask << var.decl->bit_offset);
#else
    mask2 = ~(mask << (size - var.decl->bit_offset - width));
#endif
    temp_op1 = get_new_temp (c2m_ctx, MIR_T_I64);
    temp_op2 = get_new_temp (c2m_ctx, MIR_T_I64);
    temp_op3 = get_new_temp (c2m_ctx, MIR_T_I64);
    if (!ignore_others_p) {
      emit2_noopt (c2m_ctx, MIR_MOV, temp_op2.mir_op, var.mir_op);
      emit3 (c2m_ctx, MIR_AND, temp_op2.mir_op, temp_op2.mir_op, MIR_new_uint_op (ctx, mask2));
    }
    if (!signed_integer_type_p (var.decl->decl_spec.type)) {
      emit2 (c2m_ctx, MIR_MOV, temp_op1.mir_op, val->mir_op);
      *val = temp_op3;
    } else {
      emit3 (c2m_ctx, MIR_LSH, temp_op1.mir_op, val->mir_op, MIR_new_int_op (ctx, 64 - width));
      emit3 (c2m_ctx, MIR_RSH, temp_op1.mir_op, temp_op1.mir_op, MIR_new_int_op (ctx, 64 - width));
      *val = temp_op1;
    }
    emit3 (c2m_ctx, MIR_AND, temp_op3.mir_op, temp_op1.mir_op, MIR_new_uint_op (ctx, mask));
    temp_op4 = get_new_temp (c2m_ctx, MIR_T_I64);
#if __BYTE_ORDER__ == __ORDER_LITTLE_ENDIAN__
    if (var.decl->bit_offset == 0) {
      temp_op4 = temp_op3;
    } else {
      emit3 (c2m_ctx, MIR_LSH, temp_op4.mir_op, temp_op3.mir_op,
             MIR_new_int_op (ctx, var.decl->bit_offset));
    }
#else
    if (size - var.decl->bit_offset - width == 0) {
      temp_op4 = temp_op3;
    } else {
      emit3 (c2m_ctx, MIR_LSH, temp_op4.mir_op, temp_op3.mir_op,
             MIR_new_int_op (ctx, size - var.decl->bit_offset - width));
    }
#endif
    if (!ignore_others_p) {
      emit3 (c2m_ctx, MIR_OR, temp_op4.mir_op, temp_op4.mir_op, temp_op2.mir_op);
    }
    emit2 (c2m_ctx, MIR_MOV, var.mir_op, temp_op4.mir_op);
  }
}